

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O1

int ppc_hash32_handle_mmu_fault_ppc(PowerPCCPU_conflict *cpu,vaddr eaddr,int rwx,int mmu_idx)

{
  bool bVar1;
  int iVar2;
  hwaddr in_RAX;
  ulong uVar3;
  hwaddr pte_offset;
  uint uVar4;
  uint uVar5;
  uint ea;
  bool bVar6;
  int prot;
  ppc_hash_pte32_t pte;
  uint local_4c;
  hwaddr local_48;
  ppc_hash_pte32_t local_40;
  ulong local_38;
  
  if (2 < (uint)rwx) {
    __assert_fail("(rwx == 0) || (rwx == 1) || (rwx == 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash32.c"
                  ,0x1b4,"int ppc_hash32_handle_mmu_fault_ppc(PowerPCCPU *, vaddr, int, int)");
  }
  ea = (uint)eaddr;
  if (rwx != 2) {
    if (((cpu->env).msr & 0x10) != 0) goto LAB_00b30ea8;
LAB_00b30e78:
    uVar3 = (ulong)(ea & 0xfffff000);
    uVar5 = 7;
    goto LAB_00b30e8d;
  }
  if (((cpu->env).msr & 0x20) == 0) goto LAB_00b30e78;
LAB_00b30ea8:
  if (((cpu->env).nb_BATs != 0) &&
     (in_RAX = ppc_hash32_bat_lookup(cpu,ea,rwx,(int *)&local_4c), in_RAX != 0xffffffffffffffff)) {
    if ((*(uint *)(&DAT_00dbc7c8 + (ulong)(uint)rwx * 4) & ~local_4c) != 0) {
LAB_00b3113c:
      if (rwx == 2) {
        (cpu->parent_obj).exception_index = 3;
        (cpu->env).error_code = 0x8000000;
      }
      else {
        (cpu->parent_obj).exception_index = 2;
        (cpu->env).error_code = 0;
        (cpu->env).spr[0x13] = ea;
        if (rwx == 1) {
          (cpu->env).spr[0x12] = 0xa000000;
        }
        else {
          (cpu->env).spr[0x12] = 0x8000000;
        }
      }
      return 1;
    }
    uVar3 = (ulong)((uint)in_RAX & 0xfffff000);
    uVar5 = local_4c;
    goto LAB_00b30e8d;
  }
  uVar5 = (cpu->env).sr[eaddr >> 0x1c];
  if (-1 < (int)uVar5) {
    if ((uVar5 >> 0x1c & 1) != 0 && rwx == 2) {
      (cpu->parent_obj).exception_index = 3;
      (cpu->env).error_code = 0x10000000;
      return 1;
    }
    pte_offset = ppc_hash32_htab_lookup(cpu,uVar5,ea,&local_40);
    if (pte_offset == 0xffffffffffffffff) {
      if (rwx == 2) {
        (cpu->parent_obj).exception_index = 3;
        (cpu->env).error_code = 0x40000000;
        return 1;
      }
      (cpu->parent_obj).exception_index = 2;
      (cpu->env).error_code = 0;
      (cpu->env).spr[0x13] = ea;
      if (rwx == 1) {
        (cpu->env).spr[0x12] = 0x42000000;
        return 1;
      }
      (cpu->env).spr[0x12] = 0x40000000;
      return 1;
    }
    if (((uint)(((cpu->env).msr & 0x4000) == 0) * 0x20000000 + 0x20000000 & uVar5) == 0) {
      uVar4 = (uint)((~local_40.pte1 & 3) != 0) * 2 + 1;
    }
    else {
      uVar4 = *(uint *)(&DAT_00db64ec + (ulong)(local_40.pte1 & 3) * 4);
    }
    uVar4 = uVar5 >> 0x1a & 4 | uVar4;
    uVar5 = uVar4 ^ 4;
    if ((*(uint *)(&DAT_00dbc7c8 + (ulong)(uint)rwx * 4) & (uVar4 ^ 0xfffffffb)) != 0)
    goto LAB_00b3113c;
    uVar3 = (ulong)local_40.pte1;
    local_4c = uVar5;
    if ((local_40.pte1 >> 8 & 1) == 0) {
      local_48 = pte_offset;
      local_38 = (ulong)local_40.pte1;
      ppc_hash32_set_r(cpu,pte_offset,local_40.pte1);
      pte_offset = local_48;
      uVar3 = local_38;
    }
    if (-1 < (char)local_40.pte1) {
      if (rwx == 1) {
        ppc_hash32_set_c(cpu,pte_offset,(ulong)local_40.pte1);
      }
      else {
        local_4c = uVar5 & 5;
      }
    }
    uVar3 = (ulong)((uint)uVar3 & 0xfffff000);
    uVar5 = local_4c;
    goto LAB_00b30e8d;
  }
  if ((uVar5 & 0x1ff00000) == 0x7f00000) {
    local_4c = 7;
    bVar1 = true;
    uVar4 = ea & 0xfffffff | uVar5 << 0x1c;
    goto LAB_00b310cc;
  }
  if (rwx == 2) {
    (cpu->parent_obj).exception_index = 3;
    (cpu->env).error_code = 0x10000000;
    goto LAB_00b310c7;
  }
  iVar2 = (cpu->env).access_type;
  bVar1 = true;
  uVar4 = ea;
  switch(iVar2 << 0x1c | iVar2 - 0x20U >> 4) {
  case 0:
    bVar6 = ((uint)(((cpu->env).msr & 0x4000) == 0) * 0x20000000 + 0x20000000 & uVar5) != 0;
    if (rwx != 1 && bVar6 || rwx != 0 && !bVar6) {
      (cpu->parent_obj).exception_index = 2;
      (cpu->env).error_code = 0;
      (cpu->env).spr[0x13] = ea;
      if (rwx == 1) {
        (cpu->env).spr[0x12] = 0xa000000;
      }
      else {
        (cpu->env).spr[0x12] = 0x8000000;
      }
      break;
    }
    goto LAB_00b310cc;
  case 1:
    (cpu->parent_obj).exception_index = 5;
    (cpu->env).error_code = 1;
    (cpu->env).spr[0x13] = ea;
    break;
  case 2:
    (cpu->env).error_code = 0;
    (cpu->env).spr[0x13] = ea;
    if (rwx == 1) {
      (cpu->env).spr[0x12] = 0x6000000;
    }
    else {
      (cpu->env).spr[0x12] = 0x4000000;
    }
    break;
  case 3:
    (cpu->parent_obj).exception_index = 2;
    (cpu->env).error_code = 0;
    (cpu->env).spr[0x13] = ea;
    if (rwx == 1) {
      (cpu->env).spr[0x12] = 0x6100000;
    }
    else {
      (cpu->env).spr[0x12] = 0x4100000;
    }
    break;
  case 4:
    goto LAB_00b310cc;
  default:
    cpu_abort_ppc(&cpu->parent_obj,"ERROR: instruction should not need address translation\n",0);
  }
LAB_00b310c7:
  bVar1 = false;
  uVar4 = (uint)in_RAX;
LAB_00b310cc:
  iVar2 = 1;
  if (bVar1) {
    uVar3 = (ulong)(uVar4 & 0xfffff000);
    uVar5 = local_4c;
LAB_00b30e8d:
    tlb_set_page_ppc(&cpu->parent_obj,ea & 0xfffff000,uVar3,uVar5,mmu_idx,0x1000);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ppc_hash32_handle_mmu_fault(PowerPCCPU *cpu, vaddr eaddr, int rwx,
                                int mmu_idx)
{
    CPUState *cs = CPU(cpu);
    CPUPPCState *env = &cpu->env;
    target_ulong sr;
    hwaddr pte_offset;
    ppc_hash_pte32_t pte;
    int prot;
    const int need_prot[] = {PAGE_READ, PAGE_WRITE, PAGE_EXEC};
    hwaddr raddr;

    assert((rwx == 0) || (rwx == 1) || (rwx == 2));

    /* 1. Handle real mode accesses */
    if (((rwx == 2) && (msr_ir == 0)) || ((rwx != 2) && (msr_dr == 0))) {
        /* Translation is off */
        raddr = eaddr;
        tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                     PAGE_READ | PAGE_WRITE | PAGE_EXEC, mmu_idx,
                     TARGET_PAGE_SIZE);
        return 0;
    }

    /* 2. Check Block Address Translation entries (BATs) */
    if (env->nb_BATs != 0) {
        raddr = ppc_hash32_bat_lookup(cpu, eaddr, rwx, &prot);
        if (raddr != -1) {
            if (need_prot[rwx] & ~prot) {
                if (rwx == 2) {
                    cs->exception_index = POWERPC_EXCP_ISI;
                    env->error_code = 0x08000000;
                } else {
                    cs->exception_index = POWERPC_EXCP_DSI;
                    env->error_code = 0;
                    env->spr[SPR_DAR] = eaddr;
                    if (rwx == 1) {
                        env->spr[SPR_DSISR] = 0x0a000000;
                    } else {
                        env->spr[SPR_DSISR] = 0x08000000;
                    }
                }
                return 1;
            }

            tlb_set_page(cs, eaddr & TARGET_PAGE_MASK,
                         raddr & TARGET_PAGE_MASK, prot, mmu_idx,
                         TARGET_PAGE_SIZE);
            return 0;
        }
    }

    /* 3. Look up the Segment Register */
    sr = env->sr[eaddr >> 28];

    /* 4. Handle direct store segments */
    if (sr & SR32_T) {
        if (ppc_hash32_direct_store(cpu, sr, eaddr, rwx,
                                    &raddr, &prot) == 0) {
            tlb_set_page(cs, eaddr & TARGET_PAGE_MASK,
                         raddr & TARGET_PAGE_MASK, prot, mmu_idx,
                         TARGET_PAGE_SIZE);
            return 0;
        } else {
            return 1;
        }
    }

    /* 5. Check for segment level no-execute violation */
    if ((rwx == 2) && (sr & SR32_NX)) {
        cs->exception_index = POWERPC_EXCP_ISI;
        env->error_code = 0x10000000;
        return 1;
    }

    /* 6. Locate the PTE in the hash table */
    pte_offset = ppc_hash32_htab_lookup(cpu, sr, eaddr, &pte);
    if (pte_offset == -1) {
        if (rwx == 2) {
            cs->exception_index = POWERPC_EXCP_ISI;
            env->error_code = 0x40000000;
        } else {
            cs->exception_index = POWERPC_EXCP_DSI;
            env->error_code = 0;
            env->spr[SPR_DAR] = eaddr;
            if (rwx == 1) {
                env->spr[SPR_DSISR] = 0x42000000;
            } else {
                env->spr[SPR_DSISR] = 0x40000000;
            }
        }

        return 1;
    }
    qemu_log_mask(CPU_LOG_MMU,
                "found PTE at offset %08" HWADDR_PRIx "\n", pte_offset);

    /* 7. Check access permissions */

    prot = ppc_hash32_pte_prot(cpu, sr, pte);

    if (need_prot[rwx] & ~prot) {
        /* Access right violation */
        qemu_log_mask(CPU_LOG_MMU, "PTE access rejected\n");
        if (rwx == 2) {
            cs->exception_index = POWERPC_EXCP_ISI;
            env->error_code = 0x08000000;
        } else {
            cs->exception_index = POWERPC_EXCP_DSI;
            env->error_code = 0;
            env->spr[SPR_DAR] = eaddr;
            if (rwx == 1) {
                env->spr[SPR_DSISR] = 0x0a000000;
            } else {
                env->spr[SPR_DSISR] = 0x08000000;
            }
        }
        return 1;
    }

    qemu_log_mask(CPU_LOG_MMU, "PTE access granted !\n");

    /* 8. Update PTE referenced and changed bits if necessary */

    if (!(pte.pte1 & HPTE32_R_R)) {
        ppc_hash32_set_r(cpu, pte_offset, pte.pte1);
    }
    if (!(pte.pte1 & HPTE32_R_C)) {
        if (rwx == 1) {
            ppc_hash32_set_c(cpu, pte_offset, pte.pte1);
        } else {
            /*
             * Treat the page as read-only for now, so that a later write
             * will pass through this function again to set the C bit
             */
            prot &= ~PAGE_WRITE;
        }
     }

    /* 9. Determine the real address from the PTE */

    raddr = ppc_hash32_pte_raddr(sr, pte, eaddr);

    tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                 prot, mmu_idx, TARGET_PAGE_SIZE);

    return 0;
}